

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool __thiscall
gguf_reader::read<unsigned_short>
          (gguf_reader *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *dst,size_t n)

{
  bool bVar1;
  unsigned_short *puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RSI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDI;
  size_t i;
  unsigned_short *dst_00;
  unsigned_short *local_28;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(in_RDI,(size_type)in_RSI);
  local_28 = (unsigned_short *)0x0;
  while( true ) {
    dst_00 = local_28;
    puVar2 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(in_RSI);
    if (puVar2 <= dst_00) {
      return true;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              (in_RSI,(size_type)local_28);
    bVar1 = read<unsigned_short>((gguf_reader *)in_RDI,dst_00);
    if (!bVar1) break;
    local_28 = (unsigned_short *)((long)local_28 + 1);
  }
  return false;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }